

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O1

int Aig_ManPartitionedSat
              (Aig_Man_t *p,int nAlgo,int nPartSize,int nConfPart,int nConfTotal,int fAlignPol,
              int fSynthesize,int fVerbose)

{
  byte *pbVar1;
  void **ppvVar2;
  Aig_Man_t *pAVar3;
  void *pvVar4;
  int *__ptr;
  int iVar5;
  int iVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Man_t *pAVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  sat_solver *s;
  ulong uVar14;
  uint uVar15;
  timespec ts;
  Vec_Vec_t *vPart2Pos;
  Vec_Vec_t *vPio2Id;
  timespec local_a0;
  uint local_90;
  int local_8c;
  uint local_88;
  int local_84;
  Vec_Ptr_t *local_80;
  Vec_Int_t *local_78;
  sat_solver *local_70;
  ulong local_68;
  Vec_Ptr_t *local_60;
  Vec_Ptr_t *local_58;
  Vec_Ptr_t *local_50;
  int *local_48;
  Vec_Ptr_t *local_40;
  void **local_38;
  
  local_8c = fAlignPol;
  iVar5 = clock_gettime(3,&local_a0);
  if (iVar5 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
  }
  switch(nAlgo) {
  case 0:
    pVVar8 = Aig_ManPartitionMonolithic(p);
    goto LAB_00692f80;
  case 1:
    pVVar8 = Aig_ManPartitionLevelized(p,nPartSize);
    goto LAB_00692f80;
  case 2:
    iVar5 = 0;
    break;
  case 3:
    iVar5 = 1;
    break;
  default:
    puts("Unknown partitioning algorithm.");
    return -1;
  }
  pVVar8 = Aig_ManPartitionDfs(p,nPartSize,iVar5);
LAB_00692f80:
  if (fVerbose != 0) {
    uVar7 = pVVar8->nSize;
    if ((ulong)uVar7 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *pVVar8->pArray;
      if (1 < (int)uVar7) {
        uVar11 = 1;
        do {
          iVar6 = pVVar8->pArray[uVar11];
          if (iVar5 <= iVar6) {
            iVar5 = iVar6;
          }
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
    }
    iVar6 = 0x9e411d;
    printf("Partitioning derived %d partitions. ",(ulong)(iVar5 + 1));
    Abc_Print(iVar6,"%s =","Time");
    iVar6 = 3;
    iVar5 = clock_gettime(3,&local_a0);
    if (iVar5 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar12 - lVar13) / 1000000.0);
  }
  pVVar9 = Aig_ManPartSplit(p,pVVar8,&local_50,&local_58);
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  if (pVVar8 != (Vec_Int_t *)0x0) {
    free(pVVar8);
  }
  if (fVerbose != 0) {
    iVar5 = 0x9e4142;
    printf("Partions were transformed into AIGs. ");
    Abc_Print(iVar5,"%s =","Time");
    iVar6 = 3;
    iVar5 = clock_gettime(3,&local_a0);
    if (iVar5 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar12 - lVar13) / 1000000.0);
  }
  if ((fSynthesize != 0) && (iVar5 = pVVar9->nSize, 0 < (long)iVar5)) {
    ppvVar2 = pVVar9->pArray;
    lVar13 = 0;
    do {
      pAVar3 = (Aig_Man_t *)ppvVar2[lVar13];
      pAVar10 = Dar_ManRwsat(pAVar3,0,0);
      ppvVar2[lVar13] = pAVar10;
      Aig_ManStop(pAVar3);
      lVar13 = lVar13 + 1;
    } while (iVar5 != lVar13);
  }
  local_80 = pVVar9;
  local_70 = sat_solver_new();
  iVar5 = p->vObjs->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar6;
  if (iVar6 == 0) {
    local_48 = (int *)0x0;
  }
  else {
    local_48 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar8->pArray = local_48;
  pVVar8->nSize = iVar5;
  if (local_48 != (int *)0x0) {
    memset(local_48,0,(long)iVar5 << 2);
  }
  local_68 = (ulong)local_80->nSize;
  if ((long)local_68 < 1) {
    iVar5 = -1;
    s = local_70;
  }
  else {
    local_38 = local_80->pArray;
    local_40 = local_58;
    uVar11 = 0;
    local_90 = 0;
    local_60 = local_50;
    local_88 = nConfTotal;
    local_78 = pVVar8;
    do {
      pVVar8 = local_78;
      pAVar3 = (Aig_Man_t *)local_38[uVar11];
      iVar5 = clock_gettime(3,&local_a0);
      if (iVar5 < 0) {
        lVar13 = 1;
      }
      else {
        lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a0.tv_nsec),8);
        lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_a0.tv_sec * -1000000;
      }
      if (local_8c == 0) {
        pVVar9 = pAVar3->vObjs;
        if (0 < pVVar9->nSize) {
          lVar12 = 0;
          do {
            if (pVVar9->pArray[lVar12] != (void *)0x0) {
              pbVar1 = (byte *)((long)pVVar9->pArray[lVar12] + 0x18);
              *pbVar1 = *pbVar1 & 0xf7;
            }
            lVar12 = lVar12 + 1;
            pVVar9 = pAVar3->vObjs;
          } while (lVar12 < pVVar9->nSize);
        }
      }
      else {
        if ((long)local_60->nSize <= (long)uVar11) goto LAB_006935fa;
        Aig_ManPartSetNodePolarity(p,pAVar3,(Vec_Int_t *)local_60->pArray[uVar11]);
      }
      s = local_70;
      if ((long)local_60->nSize <= (long)uVar11) {
LAB_006935fa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      if ((long)local_40->nSize <= (long)uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      Aig_ManAddNewCnfToSolver
                (local_70,pAVar3,pVVar8,(Vec_Int_t *)local_60->pArray[uVar11],
                 (Vec_Ptr_t *)local_40->pArray[uVar11],local_8c);
      iVar6 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfTotal,0,0,0);
      if (fVerbose != 0) {
        uVar15 = local_90 + pAVar3->nObjs[5] + pAVar3->nObjs[6];
        local_84 = iVar6;
        uVar7 = sat_solver_nvars(s);
        iVar5 = 0x9e4168;
        local_90 = uVar15;
        printf("%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",uVar11 & 0xffffffff,
               (ulong)uVar15,(ulong)uVar7,(ulong)(s->stats).clauses,(ulong)(s->stats).learnts);
        Abc_Print(iVar5,"%s =","Time");
        iVar6 = 3;
        iVar5 = clock_gettime(3,&local_a0);
        if (iVar5 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_a0.tv_nsec / 1000 + local_a0.tv_sec * 1000000;
        }
        Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar12 + lVar13) / 1000000.0);
        iVar6 = local_84;
      }
      pVVar8 = local_78;
      iVar5 = 0;
      if (iVar6 != 1) {
        if (iVar6 == -1) {
          iVar5 = 1;
          break;
        }
        iVar5 = -1;
      }
      nConfTotal = nConfTotal - (int)(s->stats).conflicts;
      if (nConfTotal < 1) {
        printf("Exceeded the limit on the total number of conflicts (%d).\n",(ulong)local_88);
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_68);
  }
  if (iVar5 == 0) {
    Aig_ManDeriveCounterExample(p,pVVar8,s);
  }
  sat_solver_delete(s);
  uVar11 = local_68;
  pVVar9 = local_80;
  if (0 < (int)local_68) {
    ppvVar2 = local_80->pArray;
    uVar14 = 0;
    do {
      Aig_ManStop((Aig_Man_t *)ppvVar2[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
    pVVar9->pArray = (void **)0x0;
  }
  if (pVVar9 != (Vec_Ptr_t *)0x0) {
    free(pVVar9);
  }
  if (0 < local_50->nSize) {
    lVar13 = 0;
    do {
      pvVar4 = local_50->pArray[lVar13];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
          *(undefined8 *)((long)pvVar4 + 8) = 0;
        }
        free(pvVar4);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_50->nSize);
  }
  if (local_50->pArray != (void **)0x0) {
    free(local_50->pArray);
    local_50->pArray = (void **)0x0;
  }
  if (local_50 != (Vec_Ptr_t *)0x0) {
    free(local_50);
  }
  if (0 < local_58->nSize) {
    lVar13 = 0;
    do {
      pvVar4 = local_58->pArray[lVar13];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
          *(undefined8 *)((long)pvVar4 + 8) = 0;
        }
        free(pvVar4);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_58->nSize);
  }
  if (local_58->pArray != (void **)0x0) {
    free(local_58->pArray);
    local_58->pArray = (void **)0x0;
  }
  __ptr = local_48;
  if (local_58 != (Vec_Ptr_t *)0x0) {
    free(local_58);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    pVVar8->pArray = (int *)0x0;
  }
  free(pVVar8);
  return iVar5;
}

Assistant:

int Aig_ManPartitionedSat( Aig_Man_t * p, int nAlgo, int nPartSize, 
    int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose )
{
    sat_solver * pSat;
    Vec_Ptr_t * vAigs;
    Vec_Vec_t * vPio2Id, * vPart2Pos;
    Aig_Man_t * pAig, * pTemp;
    Vec_Int_t * vNode2Part, * vNode2Var;
    int nConfRemaining = nConfTotal, nNodes = 0;
    int i, status, RetValue = -1;
    abctime clk;

    // perform partitioning according to the selected algorithm
    clk = Abc_Clock();
    switch ( nAlgo )
    {
    case 0: 
        vNode2Part = Aig_ManPartitionMonolithic( p );
        break;
    case 1: 
        vNode2Part = Aig_ManPartitionLevelized( p, nPartSize );
        break;
    case 2: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 0 );
        break;
    case 3: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 1 );
        break;
    default:
        printf( "Unknown partitioning algorithm.\n" );
        return -1;
    }

    if ( fVerbose )
    {
    printf( "Partitioning derived %d partitions. ", Vec_IntFindMax(vNode2Part) + 1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // split the original AIG into partition AIGs (vAigs)
    // also, derives mapping of PIs/POs of partition AIGs into original nodes
    // also, derives mapping of POs of the original AIG into partitions
    vAigs = Aig_ManPartSplit( p, vNode2Part, (Vec_Ptr_t **)&vPio2Id, (Vec_Ptr_t **)&vPart2Pos );
    Vec_IntFree( vNode2Part );

    if ( fVerbose )
    {
    printf( "Partions were transformed into AIGs. " );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // synthesize partitions
    if ( fSynthesize )
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
        pAig = Dar_ManRwsat( pTemp = pAig, 0, 0 );
        Vec_PtrWriteEntry( vAigs, i, pAig );
        Aig_ManStop( pTemp );
    }

    // start the SAT solver
    pSat = sat_solver_new();
//    pSat->verbosity = fVerbose;
    // start mapping of the original AIG IDs into their SAT variable numbers
    vNode2Var = Vec_IntStart( Aig_ManObjNumMax(p) );

    // add partitions, one at a time, and run the SAT solver 
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
clk = Abc_Clock();
        // transform polarity of the AIG
        if ( fAlignPol )
            Aig_ManPartSetNodePolarity( p, pAig, Vec_VecEntryInt(vPio2Id,i) );
        else
            Aig_ManPartResetNodePolarity( pAig );
        // add CNF of this partition to the SAT solver
        if ( Aig_ManAddNewCnfToSolver( pSat, pAig, vNode2Var, 
            Vec_VecEntryInt(vPio2Id,i), Vec_VecEntry(vPart2Pos,i), fAlignPol ) )
        {
            RetValue = 1;
            break;
        }
        // call the SAT solver
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfRemaining, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",
                i, nNodes += Aig_ManNodeNum(pAig), sat_solver_nvars(pSat), 
                (int)pSat->stats.clauses, (int)pSat->stats.learnts );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
        // analize the result
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        else if ( status == l_True )
            RetValue = 0;
        else
            RetValue = -1;
        nConfRemaining -= pSat->stats.conflicts;
        if ( nConfRemaining <= 0 )
        {
            printf( "Exceeded the limit on the total number of conflicts (%d).\n", nConfTotal );
            break;
        }
    }
    if ( RetValue == 0 )
        Aig_ManDeriveCounterExample( p, vNode2Var, pSat );
    // cleanup
    sat_solver_delete( pSat );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
    Vec_VecFree( vPio2Id );
    Vec_VecFree( vPart2Pos );
    Vec_IntFree( vNode2Var );
    return RetValue;
}